

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_userid_filter_module.c
# Opt level: O3

char * ngx_http_userid_path(ngx_conf_t *cf,void *post,void *data)

{
  undefined4 *puVar1;
  char *pcVar2;
  
  puVar1 = (undefined4 *)ngx_pnalloc(cf->pool,*data + 7);
  if (puVar1 == (undefined4 *)0x0) {
    pcVar2 = (char *)0xffffffffffffffff;
  }
  else {
    *(undefined4 *)((long)puVar1 + 3) = 0x3d687461;
    *puVar1 = 0x6170203b;
    memcpy((void *)((long)puVar1 + 7),*(void **)((long)data + 8),*data);
    *(long *)data = *data + 7;
    *(undefined4 **)((long)data + 8) = puVar1;
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

static char *
ngx_http_userid_path(ngx_conf_t *cf, void *post, void *data)
{
    ngx_str_t  *path = data;

    u_char  *p, *new;

    new = ngx_pnalloc(cf->pool, sizeof("; path=") - 1 + path->len);
    if (new == NULL) {
        return NGX_CONF_ERROR;
    }

    p = ngx_cpymem(new, "; path=", sizeof("; path=") - 1);
    ngx_memcpy(p, path->data, path->len);

    path->len += sizeof("; path=") - 1;
    path->data = new;

    return NGX_CONF_OK;
}